

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.h
# Opt level: O3

int __thiscall vector<server::ban>::remove(vector<server::ban> *this,char *__filename)

{
  int iVar1;
  int in_EDX;
  long lVar2;
  long lVar3;
  
  lVar3 = *(long *)__filename;
  this[1].buf = (ban *)0x0;
  server::ban::operator=((ban *)this,(ban *)((long)in_EDX * 0x18 + lVar3));
  iVar1 = *(int *)(__filename + 0xc);
  if (in_EDX + 1 < iVar1) {
    lVar2 = (long)(in_EDX + 1);
    lVar3 = lVar2 * 0x18;
    do {
      server::ban::operator=
                ((ban *)(*(long *)__filename + (long)in_EDX * 0x18),
                 (ban *)(*(long *)__filename + lVar3));
      lVar2 = lVar2 + 1;
      iVar1 = *(int *)(__filename + 0xc);
      in_EDX = in_EDX + 1;
      lVar3 = lVar3 + 0x18;
    } while (lVar2 < iVar1);
  }
  *(int *)(__filename + 0xc) = iVar1 + -1;
  return (int)this;
}

Assistant:

T remove(int i)
    {
        T e = buf[i];
        for(int p = i+1; p<ulen; p++) buf[p-1] = buf[p];
        ulen--;
        return e;
    }